

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.h
# Opt level: O0

void __thiscall
Diligent::ShaderCodeVariableDesc::ShaderCodeVariableDesc(ShaderCodeVariableDesc *this)

{
  ShaderCodeVariableDesc *this_local;
  
  this->Name = (char *)0x0;
  this->TypeName = (char *)0x0;
  this->Class = SHADER_CODE_VARIABLE_CLASS_UNKNOWN;
  this->BasicType = SHADER_CODE_BASIC_TYPE_UNKNOWN;
  this->NumRows = '\0';
  this->NumColumns = '\0';
  this->Offset = 0;
  this->ArraySize = 0;
  this->NumMembers = 0;
  this->pMembers = (ShaderCodeVariableDesc *)0x0;
  return;
}

Assistant:

constexpr ShaderCodeVariableDesc() noexcept
    {}